

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O2

void __thiscall asmjit::X86RAPass::loadState(X86RAPass *this,RAState *src_)

{
  byte bVar1;
  void *pvVar2;
  VirtReg *pVVar3;
  long lVar4;
  size_t sVar5;
  RAState RVar6;
  uint uVar7;
  uint uVar8;
  X86RAState *src;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  pvVar2 = (this->super_RAPass)._contextVd.super_ZoneVectorBase._data;
  sVar5 = (this->super_RAPass)._contextVd.super_ZoneVectorBase._length;
  uVar7 = (uint)*(ushort *)(src_ + 0x148);
  bVar1 = (this->_regCount).field_0.field_0._gp;
  for (uVar11 = 0; bVar1 != uVar11; uVar11 = uVar11 + 1) {
    pVVar3 = *(VirtReg **)(src_ + uVar11 * 8);
    (this->_x86State).field_0._list[uVar11] = pVVar3;
    if (pVVar3 != (VirtReg *)0x0) {
      pVVar3->_state = '\x01';
      pVVar3->_physId = (uint8_t)uVar11;
      pVVar3->_modified = (byte)uVar7 & 1;
    }
    uVar7 = uVar7 >> 1;
  }
  RVar6 = src_[0x14a];
  bVar1 = (this->_regCount).field_0.field_0._mm;
  for (uVar11 = 0; bVar1 != uVar11; uVar11 = uVar11 + 1) {
    lVar4 = *(long *)(src_ + uVar11 * 8 + 0x80);
    *(long *)((long)&(this->_x86State).field_0 + uVar11 * 8 + 0x80) = lVar4;
    if (lVar4 != 0) {
      *(undefined1 *)(lVar4 + 0x24) = 1;
      *(char *)(lVar4 + 0x25) = (char)uVar11;
      *(byte *)(lVar4 + 0x26) = (byte)RVar6 & 1;
    }
    RVar6 = (RAState)((byte)RVar6 >> 1);
  }
  uVar7 = *(uint *)(src_ + 0x14c);
  bVar1 = (this->_regCount).field_0.field_0._vec;
  for (uVar11 = 0; bVar1 != uVar11; uVar11 = uVar11 + 1) {
    lVar4 = *(long *)(src_ + uVar11 * 8 + 0xc0);
    *(long *)((long)&(this->_x86State).field_0 + uVar11 * 8 + 0xc0) = lVar4;
    if (lVar4 != 0) {
      *(undefined1 *)(lVar4 + 0x24) = 1;
      *(char *)(lVar4 + 0x25) = (char)uVar11;
      *(byte *)(lVar4 + 0x26) = (byte)uVar7 & 1;
    }
    uVar7 = uVar7 >> 1;
  }
  (this->_x86State)._occupied.field_0 = *(anon_union_8_2_a70401ef_for_X86RegMask_0 *)(src_ + 0x140);
  (this->_x86State)._modified.field_0 = *(anon_union_8_2_a70401ef_for_X86RegMask_0 *)(src_ + 0x148);
  for (uVar11 = 0; (uint)sVar5 != uVar11; uVar11 = uVar11 + 1) {
    if (((byte)src_[uVar11 + 0x150] & 3) != 1) {
      lVar4 = *(long *)((long)pvVar2 + uVar11 * 8);
      *(byte *)(lVar4 + 0x24) = (byte)src_[uVar11 + 0x150] & 3;
      *(undefined2 *)(lVar4 + 0x25) = 0xff;
    }
  }
  uVar7 = (this->_regCount).field_0._packed;
  uVar10 = 1;
  for (uVar11 = 0; (uVar7 & 0xff) != uVar11; uVar11 = uVar11 + 1) {
    pVVar3 = (this->_x86State).field_0._list[uVar11];
    uVar8 = (uint)(this->_x86State)._occupied.field_0.field_0._gp;
    uVar9 = (uint)(this->_x86State)._modified.field_0.field_0._gp;
    if (pVVar3 == (VirtReg *)0x0) {
      if ((uVar10 & uVar8) != 0) goto LAB_001200b0;
      if ((uVar10 & uVar9) != 0) goto LAB_001200c8;
    }
    else {
      if ((uVar10 & uVar8) == 0) goto LAB_00120038;
      if ((uVar10 & uVar9) != (uint)(pVVar3->_modified != '\0') << ((byte)uVar11 & 0x1f))
      goto LAB_00120050;
      if (((pVVar3->_regInfo)._signature & 0xf00) != 0) goto LAB_00120068;
      if (pVVar3->_state != '\x01') goto LAB_00120080;
      if (uVar11 != pVVar3->_physId) goto LAB_00120098;
    }
    uVar10 = uVar10 * 2;
  }
  uVar10 = 1;
  for (uVar11 = 0; (uVar7 >> 0x10 & 0xff) != uVar11; uVar11 = uVar11 + 1) {
    lVar4 = *(long *)((long)&(this->_x86State).field_0 + uVar11 * 8 + 0x80);
    uVar8 = (uint)(this->_x86State)._occupied.field_0.field_0._mm;
    uVar9 = (uint)(this->_x86State)._modified.field_0.field_0._mm;
    if (lVar4 == 0) {
      if ((uVar10 & uVar8) != 0) goto LAB_001200b0;
      if ((uVar10 & uVar9) != 0) goto LAB_001200c8;
    }
    else {
      if ((uVar10 & uVar8) == 0) goto LAB_00120038;
      if ((uVar10 & uVar9) != (uint)(*(char *)(lVar4 + 0x26) != '\0') << ((byte)uVar11 & 0x1f))
      goto LAB_00120050;
      if ((*(uint *)(lVar4 + 4) & 0xf00) != 0x200) goto LAB_00120068;
      if (*(char *)(lVar4 + 0x24) != '\x01') goto LAB_00120080;
      if (uVar11 != *(byte *)(lVar4 + 0x25)) goto LAB_00120098;
    }
    uVar10 = uVar10 * 2;
  }
  uVar10 = (this->_x86State)._occupied.field_0.field_0._vec;
  uVar8 = (this->_x86State)._modified.field_0.field_0._vec;
  uVar9 = 1;
  uVar11 = 0;
  do {
    if ((uVar7 >> 8 & 0xff) == uVar11) {
      return;
    }
    lVar4 = *(long *)((long)&(this->_x86State).field_0 + uVar11 * 8 + 0xc0);
    if (lVar4 == 0) {
      if ((uVar9 & uVar10) != 0) {
LAB_001200b0:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/x86/x86regalloc.cpp"
                   ,0x256,"(occupied & regMask) == 0");
      }
      if ((uVar9 & uVar8) != 0) {
LAB_001200c8:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/x86/x86regalloc.cpp"
                   ,599,"(modified & regMask) == 0");
      }
    }
    else {
      if ((uVar9 & uVar10) == 0) {
LAB_00120038:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/x86/x86regalloc.cpp"
                   ,0x25a,"(occupied & regMask) != 0");
      }
      if ((uVar9 & uVar8) != (uint)(*(char *)(lVar4 + 0x26) != '\0') << ((byte)uVar11 & 0x1f)) {
LAB_00120050:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/x86/x86regalloc.cpp"
                   ,0x25b,
                   "(modified & regMask) == (static_cast<uint32_t>(vreg->isModified()) << physId)");
      }
      if ((*(uint *)(lVar4 + 4) & 0xf00) != 0x100) {
LAB_00120068:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/x86/x86regalloc.cpp"
                   ,0x25d,"vreg->getKind() == C");
      }
      if (*(char *)(lVar4 + 0x24) != '\x01') {
LAB_00120080:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/x86/x86regalloc.cpp"
                   ,0x25e,"vreg->getState() == VirtReg::kStateReg");
      }
      if (uVar11 != *(byte *)(lVar4 + 0x25)) {
LAB_00120098:
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/chenzhuoyu[P]FastRegExp/thirdparty/asmjit/src/asmjit/x86/x86regalloc.cpp"
                   ,0x25f,"vreg->getPhysId() == physId");
      }
    }
    uVar11 = uVar11 + 1;
    uVar9 = uVar9 * 2;
  } while( true );
}

Assistant:

ASMJIT_INLINE T* getData() noexcept { return static_cast<T*>(_data); }